

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

bool qt_painterpath_check_crossing(QPainterPath *path,QRectF *rect)

{
  ElementType EVar1;
  QPainterPathPrivate *pQVar2;
  Element *pEVar3;
  qreal x2;
  qreal y2;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  QBezier local_98;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  iVar12 = 0;
  iVar13 = 0;
  do {
    pQVar2 = (path->d_ptr).d.ptr;
    iVar11 = 0;
    if (pQVar2 != (QPainterPathPrivate *)0x0) {
      iVar11 = (int)(pQVar2->elements).d.size;
    }
    if (iVar11 <= iVar12) {
      bVar8 = qFuzzyCompare(&local_48,&local_58);
      if (!bVar8) {
        bVar8 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect)
        ;
        bVar10 = true;
        if (bVar8) goto LAB_003e3101;
      }
      bVar10 = false;
      goto LAB_003e3101;
    }
    pEVar3 = (pQVar2->elements).d.ptr;
    x2 = pEVar3[iVar12].x;
    y2 = pEVar3[iVar12].y;
    EVar1 = pEVar3[iVar12].type;
    qVar4 = x2;
    qVar5 = y2;
    if (EVar1 == MoveToElement) {
      qVar6 = x2;
      qVar7 = y2;
      if (0 < iVar12) {
        dVar16 = local_48.xp - local_58.xp;
        uVar14 = -(ulong)(dVar16 < -dVar16);
        uVar15 = -(ulong)(local_48.xp < -local_48.xp);
        dVar17 = (double)(~uVar15 & (ulong)local_48.xp | (ulong)-local_48.xp & uVar15);
        uVar15 = -(ulong)(local_58.xp < -local_58.xp);
        dVar18 = (double)(~uVar15 & (ulong)local_58.xp | (ulong)-local_58.xp & uVar15);
        if (dVar18 <= dVar17) {
          dVar17 = dVar18;
        }
        if ((double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14) * 1000000000000.0 <= dVar17)
        {
          dVar16 = local_48.yp - local_58.yp;
          uVar14 = -(ulong)(dVar16 < -dVar16);
          uVar15 = -(ulong)(local_48.yp < -local_48.yp);
          dVar17 = (double)(~uVar15 & (ulong)local_48.yp | (ulong)-local_48.yp & uVar15);
          uVar15 = -(ulong)(local_58.yp < -local_58.yp);
          dVar18 = (double)(~uVar15 & (ulong)local_58.yp | (ulong)-local_58.yp & uVar15);
          if (dVar18 <= dVar17) {
            dVar17 = dVar18;
          }
          if (((double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14) * 1000000000000.0 <=
               dVar17) &&
             (bVar8 = qt_painterpath_isect_line_rect
                                (local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect), bVar8))
          goto LAB_003e30c0;
        }
      }
    }
    else if (EVar1 == LineToElement) {
      bVar8 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,x2,y2,rect);
      qVar6 = local_58.xp;
      qVar7 = local_58.yp;
      if (bVar8) goto LAB_003e30c0;
    }
    else {
      qVar6 = local_58.xp;
      qVar7 = local_58.yp;
      qVar4 = local_48.xp;
      qVar5 = local_48.yp;
      if (EVar1 == CurveToElement) {
        qVar4 = pEVar3[iVar12 + 2].x;
        qVar5 = pEVar3[iVar12 + 2].y;
        local_98.x3 = pEVar3[(long)iVar12 + 1].x;
        local_98.y3 = pEVar3[(long)iVar12 + 1].y;
        local_98.x1 = local_48.xp;
        local_98.y1 = local_48.yp;
        local_98.x2 = x2;
        local_98.y2 = y2;
        local_98.x4 = qVar4;
        local_98.y4 = qVar5;
        bVar8 = qt_isect_curve_horizontal(&local_98,rect->yp,rect->xp,rect->w + rect->xp,0);
        if ((((bVar8) ||
             (bVar8 = qt_isect_curve_horizontal
                                (&local_98,rect->yp + rect->h,rect->xp,rect->w + rect->xp,0), bVar8)
             ) || (bVar8 = qt_isect_curve_vertical(&local_98,rect->xp,rect->yp,rect->h + rect->yp,0)
                  , bVar8)) ||
           (bVar8 = qt_isect_curve_vertical
                              (&local_98,rect->xp + rect->w,rect->yp,rect->h + rect->yp,0),
           iVar12 = iVar12 + 2, qVar6 = local_58.xp, qVar7 = local_58.yp, bVar8)) {
LAB_003e30c0:
          bVar10 = true;
LAB_003e3101:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return bVar10;
        }
      }
    }
    local_48.yp = qVar5;
    local_48.xp = qVar4;
    local_58.yp = qVar7;
    local_58.xp = qVar6;
    dVar17 = rect->xp;
    if ((dVar17 != local_48.xp) || (NAN(dVar17) || NAN(local_48.xp))) {
      dVar16 = rect->w + dVar17;
      if ((dVar16 == local_48.xp) && (!NAN(dVar16) && !NAN(local_48.xp))) goto LAB_003e3013;
      dVar16 = rect->yp;
LAB_003e3034:
      if ((dVar16 != local_48.yp) || (NAN(dVar16) || NAN(local_48.yp))) {
        if (dVar17 <= local_48.xp) {
          dVar16 = dVar16 + rect->h;
          if ((dVar16 == local_48.yp) && (!NAN(dVar16) && !NAN(local_48.yp))) goto LAB_003e3059;
        }
      }
      else if (dVar17 <= local_48.xp) {
LAB_003e3059:
        if (local_48.xp <= dVar17 + rect->w) goto LAB_003e3087;
      }
      bVar9 = QRectF::contains((QPointF *)rect);
      if (iVar13 == 0) {
        iVar13 = 2 - (uint)bVar9;
      }
      else if (iVar13 == 1) {
        iVar13 = 1;
        if (bVar9 == 0) goto LAB_003e30c0;
      }
      else {
        iVar13 = 2;
        if (bVar9 != 0) goto LAB_003e30c0;
      }
    }
    else {
LAB_003e3013:
      dVar16 = rect->yp;
      if ((local_48.yp < dVar16) || (rect->h + dVar16 < local_48.yp)) goto LAB_003e3034;
LAB_003e3087:
      bVar8 = qFuzzyCompare(&local_48,&local_58);
      if (bVar8) {
        iVar13 = 0;
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static bool qt_painterpath_check_crossing(const QPainterPath *path, const QRectF &rect)
{
    QPointF last_pt;
    QPointF last_start;
    enum { OnRect, InsideRect, OutsideRect} edgeStatus = OnRect;
    for (int i=0; i<path->elementCount(); ++i) {
        const QPainterPath::Element &e = path->elementAt(i);

        switch (e.type) {

        case QPainterPath::MoveToElement:
            if (i > 0
                && qFuzzyCompare(last_pt.x(), last_start.x())
                && qFuzzyCompare(last_pt.y(), last_start.y())
                && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                                  last_start.x(), last_start.y(), rect))
                return true;
            last_start = last_pt = e;
            break;

        case QPainterPath::LineToElement:
            if (qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(), e.x, e.y, rect))
                return true;
            last_pt = e;
            break;

        case QPainterPath::CurveToElement:
            {
                QPointF cp2 = path->elementAt(++i);
                QPointF ep = path->elementAt(++i);
                QBezier bezier = QBezier::fromPoints(last_pt, e, cp2, ep);
                if (qt_isect_curve_horizontal(bezier, rect.top(), rect.left(), rect.right())
                    || qt_isect_curve_horizontal(bezier, rect.bottom(), rect.left(), rect.right())
                    || qt_isect_curve_vertical(bezier, rect.left(), rect.top(), rect.bottom())
                    || qt_isect_curve_vertical(bezier, rect.right(), rect.top(), rect.bottom()))
                    return true;
                last_pt = ep;
            }
            break;

        default:
            break;
        }
        // Handle crossing the edges of the rect at the end-points of individual sub-paths.
        // A point on on the edge itself is considered neither inside nor outside for this purpose.
        if (!pointOnEdge(rect, last_pt)) {
            bool contained = rect.contains(last_pt);
            switch (edgeStatus) {
            case OutsideRect:
                if (contained)
                    return true;
                break;
            case InsideRect:
                if (!contained)
                    return true;
                break;
            case OnRect:
                edgeStatus = contained ? InsideRect : OutsideRect;
                break;
            }
        } else {
            if (last_pt == last_start)
                edgeStatus = OnRect;
        }
    }

    // implicitly close last subpath
    if (last_pt != last_start
        && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                          last_start.x(), last_start.y(), rect))
        return true;

    return false;
}